

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

optional<metaf::TemperatureGroup> *
metaf::TemperatureGroup::parse
          (optional<metaf::TemperatureGroup> *__return_storage_ptr__,string *group,
          ReportPart reportPart,ReportMetadata *reportMetadata)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  pointer psVar7;
  byte bVar8;
  uint uVar9;
  ushort uVar10;
  long lVar11;
  ulong uVar12;
  undefined1 uVar13;
  undefined8 unaff_R13;
  ulong uVar14;
  ulong uVar15;
  undefined1 uVar16;
  undefined2 uVar17;
  optional<metaf::Temperature> oVar18;
  smatch match;
  int local_80;
  string_type local_78;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58;
  
  if ((parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
       rgx_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                                   ::rgx_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
                rgx_abi_cxx11_,"(M?\\d\\d|//)/(M?\\d\\d|//)?",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                  ::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                         ::rgx_abi_cxx11_);
  }
  if ((parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
       rmkRgx_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                                   ::rmkRgx_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
                rmkRgx_abi_cxx11_,"T([01]\\d\\d\\d)([01]\\d\\d\\d)?",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                  ::rmkRgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                         ::rmkRgx_abi_cxx11_);
  }
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_begin._M_current = (char *)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (reportPart == RMK) {
    local_58._M_begin._M_current = (char *)0x0;
    local_58.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    iVar5 = std::__cxx11::string::compare((char *)group);
    if (iVar5 == 0) {
      (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload
      .super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.tp = T_MISG;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)group);
      if (iVar5 != 0) {
        _Var1._M_current = (group->_M_dataplus)._M_p;
        bVar4 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (_Var1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(_Var1._M_current + group->_M_string_length),&local_58,
                           &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                            ::rmkRgx_abi_cxx11_,0);
        if (!bVar4) goto LAB_001b144c;
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&local_78,&local_58,1);
        if ((local_78._M_string_length == 4) && ((*local_78._M_dataplus._M_p & 0xfeU) == 0x30)) {
          lVar11 = 1;
          iVar5 = 0;
          do {
            bVar8 = local_78._M_dataplus._M_p[lVar11] - 0x3a;
            if (bVar8 < 0xf6) {
              iVar5 = 0;
              break;
            }
            iVar5 = (uint)(byte)(local_78._M_dataplus._M_p[lVar11] - 0x30) + iVar5 * 10;
            lVar11 = lVar11 + 1;
          } while ((int)lVar11 != 4);
          if (bVar8 < 0xf6) goto LAB_001b1234;
          iVar6 = -iVar5;
          if (*local_78._M_dataplus._M_p != 0x31) {
            iVar6 = iVar5;
          }
          dVar2 = round((double)((float)iVar6 / 10.0) * 10.0);
          local_80 = (int)dVar2;
          uVar14 = (ulong)((float)iVar6 / 10.0 < 0.0) + 0x100000100;
          uVar13 = 1;
        }
        else {
LAB_001b1234:
          uVar14 = 0;
          local_80 = 0;
          uVar13 = 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((uVar14 & 0x100000000) == 0) goto LAB_001b144c;
        if (local_58.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_58.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar4 = false;
        }
        else {
          bVar4 = ((long)local_58.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_58.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 6U
                  < 0xfffffffffffffffd;
        }
        psVar7 = local_58.
                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -3;
        if (bVar4) {
          psVar7 = local_58.
                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2;
        }
        uVar12 = 0;
        uVar9 = 0;
        if (psVar7->matched == true) {
          uVar15 = 0;
          uVar10 = 0;
          if ((psVar7->
              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).second._M_current !=
              (psVar7->
              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).first._M_current) {
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::str(&local_78,&local_58,2);
            oVar18 = Temperature::fromRemarkString(&local_78);
            uVar15 = oVar18.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
                     super__Optional_payload_base<metaf::Temperature>._M_payload._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if (((undefined1  [16])
                 oVar18.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
                 super__Optional_payload_base<metaf::Temperature> & (undefined1  [16])0x100000000)
                == (undefined1  [16])0x0) {
              (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
              _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.
              dp.tempValue.super__Optional_base<int,_true,_true>._M_payload =
                   (_Optional_payload<int,_true,_true,_true>)0x0;
              *(undefined8 *)
               &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
                _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value
                .dp.freezing = 0;
              *(undefined8 *)
               &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
                _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload = 0;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.t.
                       tempValue.super__Optional_base<int,_true,_true> + 4) = 0;
              *(undefined4 *)
               &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
                _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_engaged = 0;
              uVar12 = 0;
              uVar15 = 0;
              uVar9 = 0;
              uVar10 = 0;
            }
            else {
              uVar12 = uVar15 & 0xffffff0000000000;
              uVar9 = oVar18.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
                      super__Optional_payload_base<metaf::Temperature>._9_4_ & 0xffffff;
              uVar10 = oVar18.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
                       super__Optional_payload_base<metaf::Temperature>._M_payload._8_2_;
            }
            if (((undefined1  [16])
                 oVar18.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
                 super__Optional_payload_base<metaf::Temperature> & (undefined1  [16])0x100000000)
                == (undefined1  [16])0x0) goto LAB_001b145d;
          }
        }
        else {
          uVar15 = 0;
          uVar10 = 0;
        }
        (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.tp =
             TEMPERATURE_AND_DEW_POINT;
        *(int *)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)
                 ._M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload.
                 _M_value.t.tempValue.super__Optional_base<int,_true,_true>._M_payload = local_80;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)
                 ._M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 8) =
             uVar13;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)
                 ._M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xb)
             = 0;
        *(undefined2 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)
                 ._M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 9) =
             0;
        *(char *)((long)&(__return_storage_ptr__->
                         super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                         super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xc) =
             (char)uVar14;
        *(char *)((long)&(__return_storage_ptr__->
                         super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                         super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xd) =
             (char)(uVar14 >> 8);
        (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.dp.
        tempValue.super__Optional_base<int,_true,_true>._M_payload =
             (_Optional_payload<int,_true,_true,_true>)(uVar15 & 0xffffffffff | uVar12);
        *(ushort *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)
                 ._M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0x18
         ) = uVar10 & 0xff | (ushort)(uVar9 << 8);
        (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.
        isIncomplete = false;
        goto LAB_001b168e;
      }
      (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload
      .super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.tp = TD_MISG;
    }
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 8) = 0;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xc) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0x14) = 0
    ;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0x18) = 0
    ;
    (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.isIncomplete = true;
    (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TemperatureGroup>._M_engaged = true;
  }
  else {
    if ((reportPart == METAR) &&
       (_Var1._M_current = (group->_M_dataplus)._M_p,
       bVar4 = std::__detail::
               __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                         (_Var1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(_Var1._M_current + group->_M_string_length),&local_58,
                          &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                           ::rgx_abi_cxx11_,0), bVar4)) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_78,&local_58,1);
      iVar5 = std::__cxx11::string::compare((char *)&local_78);
      if (iVar5 == 0) {
        uVar14 = 0;
        iVar5 = 0;
LAB_001b1428:
        uVar13 = 0;
        uVar16 = 0;
      }
      else {
        uVar14 = CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
        iVar5 = 0;
        if (local_78._M_string_length != 2) {
          iVar5 = 0;
          if ((local_78._M_string_length == 3) && (iVar5 = 0, *local_78._M_dataplus._M_p == 0x4d)) {
            iVar5 = 0;
            lVar11 = 0;
            do {
              if ((byte)(local_78._M_dataplus._M_p[lVar11 + 1] - 0x3aU) < 0xf6) {
                iVar5 = 0;
                bVar4 = false;
                goto LAB_001b1417;
              }
              iVar5 = (uint)(byte)(local_78._M_dataplus._M_p[lVar11 + 1] - 0x30) + iVar5 * 10;
              lVar11 = lVar11 + 1;
            } while ((int)lVar11 != 2);
            bVar4 = true;
LAB_001b1417:
            if (bVar4) {
              iVar5 = -iVar5;
              uVar13 = 1;
              uVar14 = 0;
              uVar16 = 1;
              goto LAB_001b142b;
            }
          }
          goto LAB_001b1428;
        }
        lVar11 = 0;
        do {
          bVar8 = local_78._M_dataplus._M_p[lVar11] - 0x30;
          if (9 < bVar8) {
            iVar5 = 0;
            break;
          }
          iVar5 = (uint)bVar8 + iVar5 * 10;
          lVar11 = lVar11 + 1;
        } while ((int)lVar11 != 2);
        if (9 < bVar8) goto LAB_001b1428;
        uVar16 = 1;
        uVar14 = 0;
        uVar13 = 0;
      }
LAB_001b142b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((char)uVar14 == '\0') {
        if (local_58.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_58.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar4 = false;
        }
        else {
          bVar4 = ((long)local_58.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_58.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 6U
                  < 0xfffffffffffffffd;
        }
        psVar7 = local_58.
                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -3;
        if (bVar4) {
          psVar7 = local_58.
                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2;
        }
        uVar12 = 0;
        uVar17 = 0;
        if ((psVar7->matched == true) &&
           (uVar17 = 0,
           (psVar7->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).second._M_current !=
           (psVar7->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).first._M_current)) {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&local_78,&local_58,2);
          iVar6 = std::__cxx11::string::compare((char *)&local_78);
          if (iVar6 == 0) {
            bVar4 = false;
            uVar14 = 0;
LAB_001b1606:
            uVar17 = 0;
            uVar12 = 0;
          }
          else {
            bVar4 = true;
            uVar14 = 0;
            if (local_78._M_string_length != 2) {
              if ((local_78._M_string_length == 3) && (*local_78._M_dataplus._M_p == 0x4d)) {
                uVar12 = 0x100000000;
                uVar9 = 0;
                lVar11 = 0;
                do {
                  if ((byte)(local_78._M_dataplus._M_p[lVar11 + 1] - 0x3aU) < 0xf6) {
                    uVar9 = 0;
                    bVar3 = false;
                    goto LAB_001b15f4;
                  }
                  uVar9 = (uint)(byte)(local_78._M_dataplus._M_p[lVar11 + 1] - 0x30) + uVar9 * 10;
                  lVar11 = lVar11 + 1;
                } while ((int)lVar11 != 2);
                bVar3 = true;
LAB_001b15f4:
                uVar14 = (ulong)uVar9;
                if (bVar3) {
                  uVar14 = (ulong)-uVar9;
                  uVar17 = 1;
                  bVar4 = false;
                  goto LAB_001b1608;
                }
              }
              goto LAB_001b1606;
            }
            lVar11 = 0;
            do {
              bVar8 = local_78._M_dataplus._M_p[lVar11] - 0x30;
              if (9 < bVar8) {
                uVar14 = 0;
                break;
              }
              uVar14 = (ulong)((uint)bVar8 + (int)uVar14 * 10);
              lVar11 = lVar11 + 1;
            } while ((int)lVar11 != 2);
            if (9 < bVar8) goto LAB_001b1606;
            uVar12 = 0x100000000;
            bVar4 = false;
            uVar17 = 0;
          }
LAB_001b1608:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (bVar4) {
            (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
            _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.dp.
            tempValue.super__Optional_base<int,_true,_true>._M_payload =
                 (_Optional_payload<int,_true,_true,_true>)0x0;
            *(undefined8 *)
             &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
              _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.
              dp.freezing = 0;
            *(undefined8 *)
             &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
              _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload = 0;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.t.
                     tempValue.super__Optional_base<int,_true,_true> + 4) = 0;
            *(undefined4 *)
             &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
              _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_engaged = 0;
            goto LAB_001b145d;
          }
        }
        (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.tp =
             TEMPERATURE_AND_DEW_POINT;
        *(int *)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)
                 ._M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload.
                 _M_value.t.tempValue.super__Optional_base<int,_true,_true>._M_payload = iVar5;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)
                 ._M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 8) =
             uVar16;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)
                 ._M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xb)
             = 0;
        *(undefined2 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)
                 ._M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 9) =
             0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)
                 ._M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xc)
             = uVar13;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)
                 ._M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xd)
             = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.dp.
        tempValue.super__Optional_base<int,_true,_true>._M_payload =
             (_Optional_payload<int,_true,_true,_true>)(uVar14 & 0xffffffff | uVar12);
        *(undefined2 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)
                 ._M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0x18
         ) = uVar17;
        (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.
        isIncomplete = false;
LAB_001b168e:
        (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_engaged = true;
        goto LAB_001b145d;
      }
    }
LAB_001b144c:
    (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.dp.tempValue.
    super__Optional_base<int,_true,_true>._M_payload = (_Optional_payload<int,_true,_true,_true>)0x0
    ;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload
      .super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.dp.freezing = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload
      .super__Optional_payload_base<metaf::TemperatureGroup>._M_payload = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.t.
             tempValue.super__Optional_base<int,_true,_true> + 4) = 0;
    *(undefined4 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload
      .super__Optional_payload_base<metaf::TemperatureGroup>._M_engaged = 0;
  }
LAB_001b145d:
  if (local_58.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<TemperatureGroup> TemperatureGroup::parse(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	static const std::optional<TemperatureGroup> notRecognised;
	static const std::regex rgx("(M?\\d\\d|//)/(M?\\d\\d|//)?");
	static const auto matchTemperature = 1, matchDewPoint = 2;
	static const std::regex rmkRgx("T([01]\\d\\d\\d)([01]\\d\\d\\d)?");
	static const auto rmkMatchTemperature = 1, rmkMatchDewPoint = 2;
	std::smatch match;
	if (reportPart == ReportPart::METAR) {
		if (regex_match(group, match, rgx)) {
			const auto t = Temperature::fromString(match.str(matchTemperature));
			if (!t.has_value()) return notRecognised;
			TemperatureGroup result(Type::TEMPERATURE_AND_DEW_POINT);
			result.t = *t;
			if (match.length(matchDewPoint)) {
				const auto dp = Temperature::fromString(match.str(matchDewPoint));
				if (!dp.has_value()) return notRecognised;
				result.dp = *dp;
			}
			return result;
		}
	}
	if (reportPart == ReportPart::RMK) {
		if (group == "T") return TemperatureGroup(Type::T_MISG, true);
		if (group == "TD") return TemperatureGroup(Type::TD_MISG, true);
		if (regex_match(group, match, rmkRgx)) {
			const auto t = Temperature::fromRemarkString(match.str(rmkMatchTemperature));
			if (!t.has_value()) return notRecognised;
			TemperatureGroup result;
			result.t = *t;
			if (match.length(matchDewPoint)) {
				const auto dp = Temperature::fromRemarkString(match.str(rmkMatchDewPoint));
				if (!dp.has_value()) return notRecognised;
				result.dp = *dp;
			}
			return result;
		}
	}
	return notRecognised;
}